

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O3

void __thiscall Fl_Graphics_Driver::yxline(Fl_Graphics_Driver *this,int x,int y,int y1,int x2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined2 uVar4;
  XPoint p [3];
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  iVar2 = 1;
  if (1 < fl_line_width_) {
    iVar2 = fl_line_width_;
  }
  iVar3 = 0x7fff - iVar2;
  iVar2 = -iVar2;
  iVar1 = x;
  if (iVar3 < x) {
    iVar1 = iVar3;
  }
  uVar4 = (undefined2)iVar2;
  local_c = (short)iVar1;
  if (x < iVar2) {
    local_c = uVar4;
  }
  iVar1 = y;
  if (iVar3 < y) {
    iVar1 = iVar3;
  }
  local_a = (short)iVar1;
  if (y < iVar2) {
    local_a = uVar4;
  }
  local_6 = (undefined2)y1;
  if (iVar3 < y1) {
    local_6 = (undefined2)iVar3;
  }
  if (y1 < iVar2) {
    local_6 = uVar4;
  }
  if (x2 <= iVar3) {
    iVar3 = x2;
  }
  if (x2 < iVar2) {
    iVar3 = iVar2;
  }
  local_4 = (undefined2)iVar3;
  local_8 = local_c;
  local_2 = local_6;
  XDrawLines(fl_display,fl_window,fl_gc,&local_c,3,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::yxline(int x, int y, int y1, int x2) {
#if defined(USE_X11)
  XPoint p[3];
  p[0].x = p[1].x = clip_x(x);  p[0].y = clip_x(y);
  p[1].y = p[2].y = clip_x(y1); p[2].x = clip_x(x2);
  XDrawLines(fl_display, fl_window, fl_gc, p, 3, 0);
#elif defined(WIN32)
  if (x2 > x) x2++;
  else x2--;
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x, y1);
  LineTo(fl_gc, x2, y1);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x, y1);
  CGContextAddLineToPoint(fl_gc, x2, y1);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x  -  fl_quartz_line_width_/2, y-0.5, fl_quartz_line_width_, 1));
    CGContextFillRect(fl_gc, CGRectMake(x2-0.5, y1  - fl_quartz_line_width_/2, 1 , fl_quartz_line_width_));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}